

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O0

Vec4f embree::string_to_Vec4f(string *str)

{
  string *in_RSI;
  string *in_RDI;
  undefined8 in_XMM1_Qa;
  Vec4f VVar1;
  float w;
  float z;
  float y;
  float x;
  size_t next;
  string local_b8 [36];
  float local_94;
  string local_90 [36];
  float local_6c;
  string local_68 [36];
  float local_44;
  undefined8 local_40;
  
  local_40 = 0;
  local_44 = std::__cxx11::stof(in_RDI,(size_t *)in_RSI);
  std::__cxx11::string::substr((ulong)local_68,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_68);
  std::__cxx11::string::~string(local_68);
  local_6c = std::__cxx11::stof(in_RDI,(size_t *)in_RSI);
  std::__cxx11::string::substr((ulong)local_90,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_90);
  std::__cxx11::string::~string(local_90);
  local_94 = std::__cxx11::stof(in_RDI,(size_t *)in_RSI);
  std::__cxx11::string::substr((ulong)local_b8,(ulong)in_RSI);
  std::__cxx11::string::operator=(in_RSI,local_b8);
  std::__cxx11::string::~string(local_b8);
  VVar1.field_0._0_4_ = std::__cxx11::stof(in_RDI,(size_t *)in_RSI);
  *(float *)in_RDI = local_44;
  *(float *)&in_RDI->field_0x4 = local_6c;
  *(float *)&in_RDI->_M_string_length = local_94;
  VVar1.field_0.field_0.y = 0.0;
  *(float *)((long)&in_RDI->_M_string_length + 4) = VVar1.field_0._0_4_;
  VVar1.field_0._8_8_ = in_XMM1_Qa;
  return (Vec4f)VVar1.field_0;
}

Assistant:

Vec4f string_to_Vec4f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next); str = str.substr(next+1);
    const float z = std::stof(str,&next); str = str.substr(next+1);
    const float w = std::stof(str,&next);
    return Vec4f(x,y,z,w);
  }